

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.h
# Opt level: O0

void Parse_Block(KonohaContext *kctx,KonohaStack *sfp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  IsSeparatorFunc in_RSI;
  long in_RDI;
  kArray *unaff_retaddr;
  kNode *in_stack_00000008;
  KonohaContext *in_stack_00000010;
  int endIdx;
  int opIdx;
  int beginIdx;
  kArray *tokenList;
  char *in_stack_00000028;
  ksymbol_t name;
  kNode *block;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x58);
  uVar2 = *(undefined8 *)(in_RSI + 0x68);
  (**(code **)(*(long *)(in_RDI + 0x10) + 0x1c8))
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/parser/import/syntax.h"
             ,"Parse_Block",0x58,"tracing..");
  if ((int)uVar1 != -1) {
    AppendParsedNode(in_stack_00000010,in_stack_00000008,unaff_retaddr,(int)((ulong)in_RDI >> 0x20),
                     (int)in_RDI,in_RSI,(ParseOption)tokenList,in_stack_00000028);
    *(long *)(in_RSI + -0x38) = (long)(int)uVar2;
  }
  return;
}

Assistant:

static KMETHOD Parse_Block(KonohaContext *kctx, KonohaStack *sfp)
{
	VAR_Parse(block, name, tokenList, beginIdx, opIdx, endIdx);
	if(opIdx != -1) {
		AppendParsedNode(kctx, block, tokenList, beginIdx, endIdx, IsStatementEnd, ParseMetaPatternOption, NULL);
		KReturnUnboxValue(endIdx);
	}
}